

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  VecAccess<float,_4,_3> local_e8;
  Mat3 local_d0;
  Matrix<float,_3,_3> local_ac;
  Vector<float,_3> local_88 [2];
  Matrix<float,_3,_3> local_70;
  Matrix<float,_3,_3> local_4c;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,9>((Mat3 *)&local_70,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,3,3>(&local_4c,(MatrixCaseUtils *)&local_70,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_28,&local_4c);
  getInputValue<0,9>(&local_d0,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,3,3>(&local_ac,(MatrixCaseUtils *)&local_d0,mat_00);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_88,&local_ac);
  tcu::operator+((tcu *)&local_1c,&local_28,local_88);
  tcu::Vector<float,_4>::xyz(&local_e8,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_e8,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_ac);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_d0);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_4c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_70);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}